

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O3

uint __thiscall o3dgc::Arithmetic_Codec::stop_encoder(Arithmetic_Codec *this)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  uint uVar6;
  bool bVar7;
  
  if (this->mode != 1) {
    AC_Error("invalid to stop encoder");
  }
  this->mode = 0;
  bVar7 = 0x2000000 < this->length;
  uVar6 = 0x8000;
  if (bVar7) {
    uVar6 = 0x800000;
  }
  uVar3 = (uint)bVar7 * 0x800000 + 0x800000;
  uVar2 = this->base;
  uVar4 = uVar3 + this->base;
  this->base = uVar4;
  this->length = uVar6;
  if (CARRY4(uVar3,uVar2)) {
    puVar5 = this->ac_pointer;
    while( true ) {
      puVar1 = puVar5 + -1;
      puVar5 = puVar5 + -1;
      if (*puVar1 != 0xff) break;
      *puVar5 = '\0';
    }
    *puVar5 = *puVar1 + '\x01';
    uVar4 = this->base;
  }
  do {
    puVar5 = this->ac_pointer;
    this->ac_pointer = puVar5 + 1;
    *puVar5 = (uchar)(uVar4 >> 0x18);
    uVar4 = this->base << 8;
    this->base = uVar4;
    uVar6 = this->length << 8;
    this->length = uVar6;
  } while (uVar6 < 0x1000000);
  uVar6 = *(int *)&this->ac_pointer - *(int *)&this->code_buffer;
  if (uVar6 <= this->buffer_size) {
    return uVar6;
  }
  AC_Error("code buffer overflow");
}

Assistant:

unsigned Arithmetic_Codec::stop_encoder(void)
    {
      if (mode != 1) AC_Error("invalid to stop encoder");
      mode = 0;

      unsigned init_base = base;            // done encoding: set final data bytes

      if (length > 2 * AC__MinLength) {
        base  += AC__MinLength;                                     // base offset
        length = AC__MinLength >> 1;             // set new length for 1 more byte
      }
      else {
        base  += AC__MinLength >> 1;                                // base offset
        length = AC__MinLength >> 9;            // set new length for 2 more bytes
      }

      if (init_base > base) propagate_carry();                 // overflow = carry

      renorm_enc_interval();                // renormalization = output last bytes

      unsigned code_bytes = unsigned(ac_pointer - code_buffer);
      if (code_bytes > buffer_size) AC_Error("code buffer overflow");

      return code_bytes;                                   // number of bytes used
    }